

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O1

XmlWriter * __thiscall
Catch::XmlWriter::writeAttribute<char_const*>(XmlWriter *this,string *name,char **attribute)

{
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar1;
  ReusableStringStream rss;
  string local_58;
  ReusableStringStream local_38;
  
  local_38.super_NonCopyable._vptr_NonCopyable = (_func_int **)&PTR__ReusableStringStream_0021f288;
  pSVar1 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  local_38.m_index = StringStreams::add(&pSVar1->super_StringStreams);
  pSVar1 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  local_38.m_oss =
       *(ostream **)
        &(pSVar1->super_StringStreams).m_streams.
         super__Vector_base<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[local_38.m_index]._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  ReusableStringStream::operator<<(&local_38,attribute);
  std::__cxx11::stringbuf::str();
  writeAttribute(this,name,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  ReusableStringStream::~ReusableStringStream(&local_38);
  return this;
}

Assistant:

XmlWriter& writeAttribute( std::string const& name, T const& attribute ) {
            ReusableStringStream rss;
            rss << attribute;
            return writeAttribute( name, rss.str() );
        }